

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnfWrite.c
# Opt level: O2

Cnf_Dat_t * Cnf_ManWriteCnfOther(Cnf_Man_t *p,Vec_Ptr_t *vMapped)

{
  char cVar1;
  char *pcVar2;
  Vec_Ptr_t *pVVar3;
  Aig_Obj_t *pAVar4;
  uint uVar5;
  int iVar6;
  void *pvVar7;
  Cnf_Dat_t *pCVar8;
  int **ppiVar9;
  int *piVar10;
  int *piVar11;
  long lVar12;
  Vec_Int_t *p_00;
  long lVar13;
  int iVar14;
  int iVar15;
  ulong uVar16;
  int iVar17;
  Aig_Man_t *pAVar18;
  uint *puVar19;
  int iVar20;
  long lVar21;
  char cVar22;
  Vec_Int_t *pVVar23;
  int pVars [32];
  
  iVar14 = p->pManAig->nObjs[3];
  iVar20 = iVar14 * 4 + 1;
  iVar14 = iVar14 * 2 + 1;
  iVar15 = 0;
  do {
    if (vMapped->nSize <= iVar15) {
      pCVar8 = (Cnf_Dat_t *)calloc(1,0x48);
      pAVar18 = p->pManAig;
      pCVar8->pMan = pAVar18;
      pCVar8->nLiterals = iVar20;
      pCVar8->nClauses = iVar14;
      lVar13 = (long)iVar14;
      ppiVar9 = (int **)malloc(lVar13 * 8 + 8);
      pCVar8->pClauses = ppiVar9;
      lVar21 = (long)iVar20;
      piVar10 = (int *)malloc(lVar21 * 4);
      *ppiVar9 = piVar10;
      ppiVar9[lVar13] = piVar10 + lVar21;
      pVVar3 = pAVar18->vObjs;
      uVar16 = (ulong)pVVar3->nSize;
      piVar11 = (int *)malloc(uVar16 << 2);
      pCVar8->pObj2Clause = piVar11;
      piVar10 = (int *)malloc(uVar16 << 2);
      pCVar8->pObj2Count = piVar10;
      for (lVar12 = 0; lVar12 < (int)uVar16; lVar12 = lVar12 + 1) {
        piVar10[lVar12] = -1;
        piVar11[lVar12] = -1;
        uVar16 = (ulong)(uint)pVVar3->nSize;
      }
      pCVar8->nVars = (int)uVar16;
      for (iVar20 = 0; iVar20 < pAVar18->vCis->nSize; iVar20 = iVar20 + 1) {
        pvVar7 = Vec_PtrEntry(pAVar18->vCis,iVar20);
        piVar10[*(int *)((long)pvVar7 + 0x24)] = 0;
        pAVar18 = p->pManAig;
      }
      p_00 = Vec_IntAlloc(0x10000);
      puVar19 = (uint *)*ppiVar9;
      for (iVar20 = 0; iVar20 < vMapped->nSize; iVar20 = iVar20 + 1) {
        pvVar7 = Vec_PtrEntry(vMapped,iVar20);
        pCVar8->pObj2Clause[*(int *)((long)pvVar7 + 0x24)] =
             (int)((ulong)((long)ppiVar9 - (long)pCVar8->pClauses) >> 3);
        piVar10[*(int *)((long)pvVar7 + 0x24)] = 0;
        pcVar2 = *(char **)((long)pvVar7 + 0x28);
        iVar14 = *(int *)((long)pvVar7 + 0x24);
        cVar22 = *pcVar2;
        iVar15 = 0;
        if ('\0' < cVar22) {
          iVar15 = (int)cVar22;
        }
        lVar12 = 0;
        while (iVar15 != lVar12) {
          iVar6 = *(int *)(pcVar2 + lVar12 * 4 + 0x18);
          pVars[lVar12] = iVar6;
          lVar12 = lVar12 + 1;
          if (p->pManAig->vObjs->nSize < iVar6) {
            __assert_fail("pVars[k] <= Aig_ManObjNumMax(p->pManAig)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/cnf/cnfWrite.c"
                          ,500,"Cnf_Dat_t *Cnf_ManWriteCnfOther(Cnf_Man_t *, Vec_Ptr_t *)");
          }
        }
        if (cVar22 < '\x05') {
          Cnf_SopConvertToVector
                    (p->pSops[*(ushort *)(pcVar2 + (long)cVar22 * 4 + 0x18)],
                     (int)p->pSopSizes[*(ushort *)(pcVar2 + (long)cVar22 * 4 + 0x18)],p_00);
          pVVar23 = p_00;
        }
        else {
          pVVar23 = *(Vec_Int_t **)(pcVar2 + 0x10);
        }
        uVar5 = iVar14 * 2;
        for (iVar14 = 0; iVar14 < pVVar23->nSize; iVar14 = iVar14 + 1) {
          iVar15 = Vec_IntEntry(pVVar23,iVar14);
          *ppiVar9 = (int *)puVar19;
          ppiVar9 = ppiVar9 + 1;
          *puVar19 = uVar5;
          iVar15 = Cnf_IsopWriteCube(iVar15,(int)*pcVar2,pVars,(int *)(puVar19 + 1));
          puVar19 = puVar19 + (long)iVar15 + 1;
        }
        pCVar8->pObj2Count[*(int *)((long)pvVar7 + 0x24)] =
             pCVar8->pObj2Count[*(int *)((long)pvVar7 + 0x24)] + pVVar23->nSize;
        if ((long)*pcVar2 < 5) {
          Cnf_SopConvertToVector
                    (p->pSops[*(ushort *)(pcVar2 + (long)*pcVar2 * 4 + 0x18) ^ 0xffff],
                     (int)p->pSopSizes[*(ushort *)(pcVar2 + (long)*pcVar2 * 4 + 0x18) ^ 0xffff],p_00
                    );
          pVVar23 = p_00;
        }
        else {
          pVVar23 = *(Vec_Int_t **)(pcVar2 + 8);
        }
        for (iVar14 = 0; iVar14 < pVVar23->nSize; iVar14 = iVar14 + 1) {
          iVar15 = Vec_IntEntry(pVVar23,iVar14);
          *ppiVar9 = (int *)puVar19;
          ppiVar9 = ppiVar9 + 1;
          *puVar19 = uVar5 | 1;
          iVar15 = Cnf_IsopWriteCube(iVar15,(int)*pcVar2,pVars,(int *)(puVar19 + 1));
          puVar19 = puVar19 + (long)iVar15 + 1;
        }
        piVar10 = pCVar8->pObj2Count;
        piVar10[*(int *)((long)pvVar7 + 0x24)] =
             piVar10[*(int *)((long)pvVar7 + 0x24)] + pVVar23->nSize;
      }
      Vec_IntFree(p_00);
      lVar12 = 0;
      iVar20 = 0;
      while( true ) {
        pVVar3 = p->pManAig->vCos;
        if (pVVar3->nSize <= iVar20) break;
        pvVar7 = Vec_PtrEntry(pVVar3,iVar20);
        pCVar8->pObj2Clause[*(int *)((long)pvVar7 + 0x24)] =
             (int)((ulong)((long)ppiVar9 + (lVar12 - (long)pCVar8->pClauses)) >> 3);
        pCVar8->pObj2Count[*(int *)((long)pvVar7 + 0x24)] = 2;
        iVar14 = *(int *)((*(ulong *)((long)pvVar7 + 8) & 0xfffffffffffffffe) + 0x24);
        iVar15 = *(int *)((long)pvVar7 + 0x24);
        *(long *)((long)ppiVar9 + lVar12) = lVar12 + (long)puVar19;
        piVar10 = (int *)(lVar12 + (long)puVar19);
        *piVar10 = iVar15 * 2;
        piVar10[1] = (*(uint *)((long)pvVar7 + 8) & 1) + iVar14 * 2 ^ 1;
        *(int **)((long)ppiVar9 + lVar12 + 8) = piVar10 + 2;
        piVar10[2] = iVar15 * 2 + 1;
        piVar10[3] = (*(uint *)((long)pvVar7 + 8) & 1) + iVar14 * 2;
        iVar20 = iVar20 + 1;
        lVar12 = lVar12 + 0x10;
      }
      pAVar4 = p->pManAig->pConst1;
      pCVar8->pObj2Clause[pAVar4->Id] =
           (int)((ulong)((long)ppiVar9 + (lVar12 - (long)pCVar8->pClauses)) >> 3);
      pCVar8->pObj2Count[pAVar4->Id] = 1;
      iVar20 = pAVar4->Id;
      *(long *)((long)ppiVar9 + lVar12) = lVar12 + (long)puVar19;
      *(int *)((long)puVar19 + lVar12) = iVar20 * 2;
      if ((long)puVar19 + (lVar12 - (long)*pCVar8->pClauses) + 4 >> 2 != lVar21) {
        __assert_fail("pLits - pCnf->pClauses[0] == nLiterals",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/cnf/cnfWrite.c"
                      ,0x237,"Cnf_Dat_t *Cnf_ManWriteCnfOther(Cnf_Man_t *, Vec_Ptr_t *)");
      }
      if ((long)ppiVar9 + (lVar12 - (long)pCVar8->pClauses) + 8 >> 3 != lVar13) {
        __assert_fail("pClas - pCnf->pClauses == nClauses",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/cnf/cnfWrite.c"
                      ,0x238,"Cnf_Dat_t *Cnf_ManWriteCnfOther(Cnf_Man_t *, Vec_Ptr_t *)");
      }
      return pCVar8;
    }
    pvVar7 = Vec_PtrEntry(vMapped,iVar15);
    if ((*(uint *)((long)pvVar7 + 0x18) & 7) - 7 < 0xfffffffe) {
      __assert_fail("Aig_ObjIsNode(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/cnf/cnfWrite.c"
                    ,0x1b2,"Cnf_Dat_t *Cnf_ManWriteCnfOther(Cnf_Man_t *, Vec_Ptr_t *)");
    }
    pcVar2 = *(char **)((long)pvVar7 + 0x28);
    cVar22 = *pcVar2;
    if ((long)cVar22 < 5) {
      cVar1 = p->pSopSizes[*(ushort *)(pcVar2 + (long)cVar22 * 4 + 0x18)];
      iVar17 = (int)cVar1;
      iVar6 = Cnf_SopCountLiterals(p->pSops[*(ushort *)(pcVar2 + (long)cVar22 * 4 + 0x18)],iVar17);
      if (cVar1 < '\0') {
        __assert_fail("p->pSopSizes[uTruth] >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/cnf/cnfWrite.c"
                      ,0x1b9,"Cnf_Dat_t *Cnf_ManWriteCnfOther(Cnf_Man_t *, Vec_Ptr_t *)");
      }
      iVar14 = iVar14 + iVar17;
      iVar20 = iVar6 + iVar17 + iVar20;
LAB_0047380a:
      cVar1 = p->pSopSizes[*(ushort *)(pcVar2 + (long)cVar22 * 4 + 0x18) ^ 0xffff];
      iVar6 = (int)cVar1;
      iVar17 = Cnf_SopCountLiterals
                         (p->pSops[*(ushort *)(pcVar2 + (long)cVar22 * 4 + 0x18) ^ 0xffff],iVar6);
      if (cVar1 < '\0') {
        __assert_fail("p->pSopSizes[uTruth] >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/cnf/cnfWrite.c"
                      ,0x1c6,"Cnf_Dat_t *Cnf_ManWriteCnfOther(Cnf_Man_t *, Vec_Ptr_t *)");
      }
      iVar17 = iVar17 + iVar6;
    }
    else {
      iVar6 = Cnf_IsopCountLiterals(*(Vec_Int_t **)(pcVar2 + 0x10),(int)cVar22);
      cVar22 = *pcVar2;
      iVar14 = iVar14 + *(int *)(*(long *)(pcVar2 + 0x10) + 4);
      iVar20 = iVar6 + iVar20 + *(int *)(*(long *)(pcVar2 + 0x10) + 4);
      if (cVar22 < 5) goto LAB_0047380a;
      iVar17 = Cnf_IsopCountLiterals(*(Vec_Int_t **)(pcVar2 + 8),(int)cVar22);
      iVar6 = *(int *)(*(long *)(pcVar2 + 8) + 4);
      iVar17 = iVar17 + iVar6;
    }
    iVar20 = iVar20 + iVar17;
    iVar14 = iVar14 + iVar6;
    iVar15 = iVar15 + 1;
  } while( true );
}

Assistant:

Cnf_Dat_t * Cnf_ManWriteCnfOther( Cnf_Man_t * p, Vec_Ptr_t * vMapped )
{
    Aig_Obj_t * pObj;
    Cnf_Dat_t * pCnf;
    Cnf_Cut_t * pCut;
    Vec_Int_t * vCover, * vSopTemp;
    int OutVar, PoVar, pVars[32], * pLits, ** pClas;
    unsigned uTruth;
    int i, k, nLiterals, nClauses, Cube;

    // count the number of literals and clauses
    nLiterals = 1 + 4 * Aig_ManCoNum( p->pManAig );
    nClauses  = 1 + 2 * Aig_ManCoNum( p->pManAig );
    Vec_PtrForEachEntry( Aig_Obj_t *, vMapped, pObj, i )
    {
        assert( Aig_ObjIsNode(pObj) );
        pCut = Cnf_ObjBestCut( pObj );
        // positive polarity of the cut
        if ( pCut->nFanins < 5 )
        {
            uTruth = 0xFFFF & *Cnf_CutTruth(pCut);
            nLiterals += Cnf_SopCountLiterals( p->pSops[uTruth], p->pSopSizes[uTruth] ) + p->pSopSizes[uTruth];
            assert( p->pSopSizes[uTruth] >= 0 );
            nClauses += p->pSopSizes[uTruth];
        }
        else
        {
            nLiterals += Cnf_IsopCountLiterals( pCut->vIsop[1], pCut->nFanins ) + Vec_IntSize(pCut->vIsop[1]);
            nClauses += Vec_IntSize(pCut->vIsop[1]);
        }
        // negative polarity of the cut
        if ( pCut->nFanins < 5 )
        {
            uTruth = 0xFFFF & ~*Cnf_CutTruth(pCut);
            nLiterals += Cnf_SopCountLiterals( p->pSops[uTruth], p->pSopSizes[uTruth] ) + p->pSopSizes[uTruth];
            assert( p->pSopSizes[uTruth] >= 0 );
            nClauses += p->pSopSizes[uTruth];
        }
        else
        {
            nLiterals += Cnf_IsopCountLiterals( pCut->vIsop[0], pCut->nFanins ) + Vec_IntSize(pCut->vIsop[0]);
            nClauses += Vec_IntSize(pCut->vIsop[0]);
        }
    }

    // allocate CNF
    pCnf = ABC_CALLOC( Cnf_Dat_t, 1 );
    pCnf->pMan = p->pManAig;
    pCnf->nLiterals = nLiterals;
    pCnf->nClauses  = nClauses;
    pCnf->pClauses  = ABC_ALLOC( int *, nClauses + 1 );
    pCnf->pClauses[0] = ABC_ALLOC( int, nLiterals );
    pCnf->pClauses[nClauses] = pCnf->pClauses[0] + nLiterals;
    // create room for variable numbers
    pCnf->pObj2Clause = ABC_ALLOC( int, Aig_ManObjNumMax(p->pManAig) );
    pCnf->pObj2Count  = ABC_ALLOC( int, Aig_ManObjNumMax(p->pManAig) );
    for ( i = 0; i < Aig_ManObjNumMax(p->pManAig); i++ )
        pCnf->pObj2Clause[i] = pCnf->pObj2Count[i] = -1;
    pCnf->nVars = Aig_ManObjNumMax(p->pManAig);

    // clear the PI counters
    Aig_ManForEachCi( p->pManAig, pObj, i )
        pCnf->pObj2Count[pObj->Id] = 0;

    // assign the clauses
    vSopTemp = Vec_IntAlloc( 1 << 16 );
    pLits = pCnf->pClauses[0];
    pClas = pCnf->pClauses;
    Vec_PtrForEachEntry( Aig_Obj_t *, vMapped, pObj, i )
    {
        // remember the starting clause
        pCnf->pObj2Clause[pObj->Id] = pClas - pCnf->pClauses;
        pCnf->pObj2Count[pObj->Id] = 0;

        // get the best cut
        pCut = Cnf_ObjBestCut( pObj );
        // save variables of this cut
        OutVar = pObj->Id;
        for ( k = 0; k < (int)pCut->nFanins; k++ )
        {
            pVars[k] = pCut->pFanins[k];
            assert( pVars[k] <= Aig_ManObjNumMax(p->pManAig) );
        }

        // positive polarity of the cut
        if ( pCut->nFanins < 5 )
        {
            uTruth = 0xFFFF & *Cnf_CutTruth(pCut);
            Cnf_SopConvertToVector( p->pSops[uTruth], p->pSopSizes[uTruth], vSopTemp );
            vCover = vSopTemp;
        }
        else
            vCover = pCut->vIsop[1];
        Vec_IntForEachEntry( vCover, Cube, k )
        {
            *pClas++ = pLits;
            *pLits++ = 2 * OutVar; 
            pLits += Cnf_IsopWriteCube( Cube, pCut->nFanins, pVars, pLits );
        }
        pCnf->pObj2Count[pObj->Id] += Vec_IntSize(vCover);

        // negative polarity of the cut
        if ( pCut->nFanins < 5 )
        {
            uTruth = 0xFFFF & ~*Cnf_CutTruth(pCut);
            Cnf_SopConvertToVector( p->pSops[uTruth], p->pSopSizes[uTruth], vSopTemp );
            vCover = vSopTemp;
        }
        else
            vCover = pCut->vIsop[0];
        Vec_IntForEachEntry( vCover, Cube, k )
        {
            *pClas++ = pLits;
            *pLits++ = 2 * OutVar + 1; 
            pLits += Cnf_IsopWriteCube( Cube, pCut->nFanins, pVars, pLits );
        }
        pCnf->pObj2Count[pObj->Id] += Vec_IntSize(vCover);
    }
    Vec_IntFree( vSopTemp );

    // write the output literals
    Aig_ManForEachCo( p->pManAig, pObj, i )
    {
        // remember the starting clause
        pCnf->pObj2Clause[pObj->Id] = pClas - pCnf->pClauses;
        pCnf->pObj2Count[pObj->Id] = 2;
        // get variables
        OutVar = Aig_ObjFanin0(pObj)->Id;
        PoVar = pObj->Id;
        // first clause
        *pClas++ = pLits;
        *pLits++ = 2 * PoVar; 
        *pLits++ = 2 * OutVar + !Aig_ObjFaninC0(pObj); 
        // second clause
        *pClas++ = pLits;
        *pLits++ = 2 * PoVar + 1; 
        *pLits++ = 2 * OutVar + Aig_ObjFaninC0(pObj); 
    }
 
    // remember the starting clause
    pCnf->pObj2Clause[Aig_ManConst1(p->pManAig)->Id] = pClas - pCnf->pClauses;
    pCnf->pObj2Count[Aig_ManConst1(p->pManAig)->Id] = 1;
    // write the constant literal
    OutVar = Aig_ManConst1(p->pManAig)->Id;
    *pClas++ = pLits;
    *pLits++ = 2 * OutVar; 

    // verify that the correct number of literals and clauses was written
    assert( pLits - pCnf->pClauses[0] == nLiterals );
    assert( pClas - pCnf->pClauses == nClauses );
//Cnf_DataPrint( pCnf, 1 );
    return pCnf;
}